

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taylor_math.hpp
# Opt level: O0

void pow_taylor<double,double,6>(taylor<double,_1,_6> *t,double *x0,double *a)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  double dVar4;
  int local_2c;
  int i;
  double x0inv;
  double *a_local;
  double *x0_local;
  taylor<double,_1,_6> *t_local;
  
  if ((*x0 <= 0.0) && (*x0 <= 0.0)) {
    __assert_fail("x0 > 0 && \"pow(x,a) not real analytic at x <= 0\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/uekstrom[P]libtaylor/taylor_math.hpp"
                  ,0xc4,
                  "void pow_taylor(taylor<T, 1, N> &, const T &, const S &) [S = double, T = double, N = 6]"
                 );
  }
  dVar4 = pow(*x0,*a);
  pdVar3 = taylor<double,_1,_6>::operator[](t,0);
  *pdVar3 = dVar4;
  dVar4 = *x0;
  for (local_2c = 1; local_2c < 7; local_2c = local_2c + 1) {
    pdVar3 = taylor<double,_1,_6>::operator[](t,local_2c + -1);
    dVar1 = *pdVar3;
    dVar2 = *a;
    pdVar3 = taylor<double,_1,_6>::operator[](t,local_2c);
    *pdVar3 = (dVar1 * (1.0 / dVar4) * ((dVar2 - (double)local_2c) + 1.0)) / (double)local_2c;
  }
  return;
}

Assistant:

static void pow_taylor(taylor<T, 1, N> & t, const T & x0, const S & a) {
  if (x0 <= 0)
    assert(x0 > 0 && "pow(x,a) not real analytic at x <= 0");
  t[0] = pow(x0, a);
  T x0inv = 1 / x0;
  for (int i = 1; i <= N; i++)
    t[i] = t[i - 1] * x0inv * (a - i + 1) / i;
}